

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool check_all_vis_and_in_group(Am_Value *obj_list_value,Am_Object *group,bool want_in_sub)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_70;
  undefined1 local_68 [8];
  Am_Value_List grouped_objs;
  bool ret;
  Am_Object local_38;
  Am_Object obj_group;
  Am_Object obj;
  bool want_in_sub_local;
  Am_Object *group_local;
  Am_Value *obj_list_value_local;
  
  bVar1 = Am_Object::Valid(group);
  if (bVar1) {
    Am_Object::Am_Object(&obj_group);
    Am_Object::Am_Object(&local_38);
    Am_Value::Am_Value((Am_Value *)&grouped_objs.item,obj_list_value);
    bVar1 = Am_Valid_and_Visible_List_Or_Object((Am_Value *)&grouped_objs.item,true);
    Am_Value::~Am_Value((Am_Value *)&grouped_objs.item);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_68);
      Am_Value_List::operator=((Am_Value_List *)local_68,obj_list_value);
      Am_Value_List::Start((Am_Value_List *)local_68);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
        in_value = Am_Value_List::Get((Am_Value_List *)local_68);
        Am_Object::operator=(&obj_group,in_value);
        Am_Object::Get_Owner(&local_70,(Am_Slot_Flags)&obj_group);
        Am_Object::operator=(&local_38,&local_70);
        Am_Object::~Am_Object(&local_70);
        bVar1 = Am_Object::operator==(&local_38,group);
        if (bVar1 == want_in_sub) {
          obj_list_value_local._7_1_ = 0;
          goto LAB_0031c42b;
        }
        Am_Value_List::Next((Am_Value_List *)local_68);
      }
      obj_list_value_local._7_1_ = 1;
LAB_0031c42b:
      bVar1 = true;
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
    }
    else {
      bVar1 = false;
    }
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&obj_group);
    if (bVar1) goto LAB_0031c47f;
  }
  obj_list_value_local._7_1_ = 0;
LAB_0031c47f:
  return (bool)(obj_list_value_local._7_1_ & 1);
}

Assistant:

bool
check_all_vis_and_in_group(Am_Value obj_list_value, Am_Object group,
                           bool want_in_sub)
{
  if (group.Valid()) {
    Am_Object obj, obj_group;
    bool ret = Am_Valid_and_Visible_List_Or_Object(obj_list_value, true);
    if (ret) {
      //now check that none are in a sub-group
      Am_Value_List grouped_objs;
      grouped_objs = obj_list_value;
      for (grouped_objs.Start(); !grouped_objs.Last(); grouped_objs.Next()) {
        obj = grouped_objs.Get();
        obj_group = obj.Get_Owner();
        if ((obj_group == group) == want_in_sub)
          return false;
      }
      return true;
    }
  }
  return false;
}